

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O3

void __thiscall
soplex::
SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::add(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      *this,int n,int *i,
     number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
     *v)

{
  int32_t iVar1;
  int iVar2;
  long lVar3;
  cpp_dec_float<200U,_int,_void> *pcVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  int iVar7;
  long lVar8;
  byte bVar9;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar9 = 0;
  if (0 < n) {
    pNVar6 = this->m_elem + this->memused;
    lVar8 = 0;
    iVar7 = 0;
    do {
      if ((v->m_backend).fpclass == cpp_dec_float_NaN) {
LAB_004ff295:
        pNVar6->idx = i[lVar8];
        lVar3 = 0x1c;
        pcVar4 = &v->m_backend;
        pNVar5 = pNVar6;
        for (; lVar3 != 0; lVar3 = lVar3 + -1) {
          (pNVar5->val).m_backend.data._M_elems[0] = (pcVar4->data)._M_elems[0];
          pcVar4 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar4 + (ulong)bVar9 * -8 + 4);
          pNVar5 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)((long)pNVar5 + ((ulong)bVar9 * -2 + 1) * 4);
        }
        (pNVar6->val).m_backend.exp = (v->m_backend).exp;
        (pNVar6->val).m_backend.neg = (v->m_backend).neg;
        iVar1 = (v->m_backend).prec_elem;
        (pNVar6->val).m_backend.fpclass = (v->m_backend).fpclass;
        (pNVar6->val).m_backend.prec_elem = iVar1;
        pNVar6 = pNVar6 + 1;
        iVar7 = iVar7 + 1;
      }
      else {
        local_b8.fpclass = cpp_dec_float_finite;
        local_b8.prec_elem = 0x1c;
        local_b8.data._M_elems[0] = 0;
        local_b8.data._M_elems[1] = 0;
        local_b8.data._M_elems[2] = 0;
        local_b8.data._M_elems[3] = 0;
        local_b8.data._M_elems[4] = 0;
        local_b8.data._M_elems[5] = 0;
        local_b8.data._M_elems[6] = 0;
        local_b8.data._M_elems[7] = 0;
        local_b8.data._M_elems[8] = 0;
        local_b8.data._M_elems[9] = 0;
        local_b8.data._M_elems[10] = 0;
        local_b8.data._M_elems[0xb] = 0;
        local_b8.data._M_elems[0xc] = 0;
        local_b8.data._M_elems[0xd] = 0;
        local_b8.data._M_elems[0xe] = 0;
        local_b8.data._M_elems[0xf] = 0;
        local_b8.data._M_elems[0x10] = 0;
        local_b8.data._M_elems[0x11] = 0;
        local_b8.data._M_elems[0x12] = 0;
        local_b8.data._M_elems[0x13] = 0;
        local_b8.data._M_elems[0x14] = 0;
        local_b8.data._M_elems[0x15] = 0;
        local_b8.data._M_elems[0x16] = 0;
        local_b8.data._M_elems[0x17] = 0;
        local_b8.data._M_elems[0x18] = 0;
        local_b8.data._M_elems[0x19] = 0;
        local_b8.data._M_elems._104_5_ = 0;
        local_b8.data._M_elems[0x1b]._1_3_ = 0;
        local_b8.exp = 0;
        local_b8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_b8,0.0);
        iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&v->m_backend,&local_b8);
        if (iVar2 != 0) goto LAB_004ff295;
      }
      v = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)(&v->m_backend + 1);
      lVar8 = lVar8 + 1;
    } while (n != (int)lVar8);
    this->memused = this->memused + iVar7;
  }
  return;
}

Assistant:

void add(int n, const int i[], const R v[])
   {
      assert(n + size() <= max());

      if(n <= 0)
         return;

      int newnnz = 0;

      Nonzero<R>* e = m_elem + size();

      while(n--)
      {
         if(*v != 0.0)
         {
            assert(e != nullptr);
            e->idx = *i;
            e->val = *v;
            e++;
            ++newnnz;
         }

         i++;
         v++;
      }

      set_size(size() + newnnz);
   }